

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_then.cpp
# Opt level: O2

void __thiscall tst_qpromise_then::resolveSync(tst_qpromise_then *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QString>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar4;
  bool bVar5;
  PromiseData<QString> *this_00;
  PromiseDataBase<void,_void_()> *this_01;
  PromiseData<void> *this_02;
  QPromiseReject<QString> *in_R8;
  long lVar6;
  initializer_list<QVariant> args;
  PromiseResolver<void> resolver_2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_208;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_200;
  QArrayDataPointer<QVariant> local_1f8;
  Promise output;
  QArrayDataPointer<char16_t> local_1d0;
  QPromiseBase<void> local_1b8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_1a8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_1a0;
  function<void_()> local_198;
  QPromise<int> input;
  PromiseResolver<QString> resolver;
  anon_union_24_3_e3d07ef4_for_data local_148;
  QVariant local_128;
  QVariant local_108;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  _Any_data local_c8 [2];
  QVariantList values;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  QPromiseBase<void> local_60;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_50;
  
  values.d.size = 0;
  values.d.d = (Data *)0x0;
  values.d.ptr = (QVariant *)0x0;
  local_148._0_4_ = 0x2a;
  QtPromise::QPromise<int>::resolve(&input,(int *)local_148.data);
  output.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d6b8;
  this_00 = (PromiseData<QString> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_settled = 0;
  (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData = 0;
  (this_00->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QString>::PromiseData(this_00);
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseData<QString> *)0x0) {
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_198.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0012d970;
  output.super_QPromiseBase<QString>.m_d.d = this_00;
  local_198.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
            (&resolver,(QPromise<QString> *)&local_198);
  QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&local_198);
  QVar4 = input.super_QPromiseBase<int>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    local_148.shared = (PrivateShared *)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_148.shared = (PrivateShared *)resolver;
  }
  local_c8[0]._M_unused._M_object = (void *)0x0;
  if ((Data *)local_148.shared == (Data *)0x0) {
    local_1f8.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_148.shared)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_148.shared)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_1f8.d = (Data *)local_148.shared;
  }
  local_1d0.d = (Data *)0x0;
  if ((Data *)local_148.shared != (Data *)0x0) {
    LOCK();
    (((Data *)local_148.shared)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_148.shared)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_1f8.d != (Data *)0x0) {
    LOCK();
    (((Data *)local_1f8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_1f8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_148._8_8_ = local_1f8.d;
  local_148._16_8_ = &values;
  local_e8._M_unused._0_8_ = local_148.shared;
  local_88._M_unused._M_object = operator_new(0x18);
  *(PrivateShared **)local_88._M_unused._0_8_ = local_148.shared;
  if ((Data *)local_148.shared != (Data *)0x0) {
    LOCK();
    *(int *)local_148.shared = *(int *)local_148.shared + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = local_148._8_8_;
  if ((Data *)local_148._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._8_8_ = *(int *)local_148._8_8_ + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 0x10) = local_148._16_8_;
  pcStack_70 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseHandler<int,tst_qpromise_then::resolveSync()::$_0,int>::
  create<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(tst_qpromise_then::resolveSync()::$_0_const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)local_148.data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  QVar4 = input.super_QPromiseBase<int>.m_d;
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>
            (&local_50,(PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_e8,
             (QPromiseResolve<QString> *)&local_1f8,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             &local_1f8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             &local_1d0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             &local_e8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             local_c8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  output.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d970;
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(input.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  local_1b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d688;
  this_01 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  *(undefined8 *)&(this_01->m_lock).field_0x0 = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)&this_01->_vptr_PromiseDataBase)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_01->super_QSharedData).ref = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_01);
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_01 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_198.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0012d718;
  local_1b8.m_d.d = (PromiseData<void> *)this_01;
  local_198.super__Function_base._M_functor._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&resolver,(QPromise<void> *)&local_198);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_198);
  QVar2 = output.super_QPromiseBase<QString>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)(Data *)0x0
    ;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_200.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_200.d = (Data *)resolver.m_d.d;
  }
  local_208.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_200.d != (Data *)0x0) {
    LOCK();
    (((Data *)local_200.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_200.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d8 = (code *)0x0;
  pcStack_d0 = (code *)0x0;
  local_1f8.d = (Data *)resolver.m_d.d;
  local_148._0_8_ = resolver.m_d.d;
  local_148._8_8_ = local_200.d;
  local_148._16_8_ = &values;
  local_e8._M_unused._M_object = operator_new(0x18);
  *(PrivateShared **)local_e8._M_unused._0_8_ = local_148.shared;
  if ((Data *)local_148.shared != (Data *)0x0) {
    LOCK();
    *(int *)local_148.shared = *(int *)local_148.shared + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_e8._M_unused._0_8_ + 8) = local_148._8_8_;
  if ((Data *)local_148._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._8_8_ = *(int *)local_148._8_8_ + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_e8._M_unused._0_8_ + 0x10) = local_148._16_8_;
  pcStack_d0 = std::
               _Function_handler<void_(const_QString_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(const_QString_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseHandler<QString,tst_qpromise_then::resolveSync()::$_1,QString_const&>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_then::resolveSync()::$_1_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(QString_const&)#1}::~function((_lambda_QString_const___1_ *)local_148.data);
  QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>,
             (function<void_(const_QString_&)> *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  QVar2 = output.super_QPromiseBase<QString>.m_d;
  QtPromisePrivate::PromiseCatcher<QString,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_c8,
             (PromiseCatcher<QString,decltype(nullptr),void> *)0x0,&local_1f8,
             (QPromiseResolve<void> *)&local_200,(QPromiseReject<void> *)in_R8);
  QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_c8);
  std::_Function_base::~_Function_base((_Function_base *)local_c8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_200);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_208);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_1f8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &resolver);
  local_1b8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d718;
  bVar5 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isPending
                    (&(output.super_QPromiseBase<QString>.m_d.d)->
                      super_PromiseDataBase<QString,_void_(const_QString_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::dispatch
              (&(output.super_QPromiseBase<QString>.m_d.d)->
                super_PromiseDataBase<QString,_void_(const_QString_&)>);
  }
  local_1d0.d = (Data *)&PTR__QPromiseBase_0012d688;
  this_02 = (PromiseData<void> *)operator_new(0x58);
  (this_02->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this_02->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this_02);
  LOCK();
  pQVar1 = &(this_02->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_02 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(this_02->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1f8.d._0_1_ = 0x18;
  local_1f8.d._1_7_ = 0x12d7;
  local_1f8.ptr = (QVariant *)this_02;
  local_1d0.ptr = (char16_t *)this_02;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_2,(QPromise<void> *)&local_1f8)
  ;
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_1f8);
  QVar3.d = local_1b8.m_d.d;
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_200.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_200 = resolver_2.m_d.d;
  }
  local_208.d = (Data *)0x0;
  if (local_200.d == (Data *)0x0) {
    local_1a0.d = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_200.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_200.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_1a0.d = local_200.d;
  }
  local_1a8.d = (Data *)0x0;
  if (local_200.d != (Data *)0x0) {
    LOCK();
    ((local_200.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_200.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_1a0.d != (Data *)0x0) {
    LOCK();
    ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_198.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_198.super__Function_base._M_functor._8_8_ = 0;
  local_198.super__Function_base._M_manager = (_Manager_type)0x0;
  local_198._M_invoker = (_Invoker_type)0x0;
  local_148.shared = (PrivateShared *)local_200.d;
  local_148._8_8_ = local_1a0.d;
  local_148._16_8_ = &values;
  local_198.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  *(PrivateShared **)local_198.super__Function_base._M_functor._M_unused._0_8_ = local_148.shared;
  if ((Data *)local_148.shared != (Data *)0x0) {
    LOCK();
    *(int *)local_148.shared = *(int *)local_148.shared + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 8) =
       local_148._8_8_;
  if ((Data *)local_148._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._8_8_ = *(int *)local_148._8_8_ + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       local_148._16_8_;
  local_198._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_invoke;
  local_198.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_manager;
  QtPromisePrivate::PromiseHandler<void,tst_qpromise_then::resolveSync()::$_2,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_then::resolveSync()::$_2_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)local_148.data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar3.d)->super_PromiseDataBase<void,_void_()>,&local_198);
  std::_Function_base::~_Function_base(&local_198.super__Function_base);
  QVar3.d = local_1b8.m_d.d;
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_200,
             (QPromiseResolve<void> *)&local_1a0,(QPromiseReject<void> *)in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar3.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  std::_Function_base::~_Function_base((_Function_base *)&resolver);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_1a0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_1a8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_200);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_208);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  local_1d0.d = (Data *)&PTR__QPromiseBase_0012d718;
  bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(local_1b8.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(local_1b8.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  QtPromise::QPromiseBase<void>::wait(&local_60,&local_1d0);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_60);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_1d0);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_1b8);
  QVariant::QVariant((QVariant *)&local_148,0x2a);
  QString::QString((QString *)&local_1d0,"43");
  QVariant::QVariant(&local_128,(QString *)&local_1d0);
  QVariant::QVariant(&local_108,0x2c);
  args._M_len = 3;
  args._M_array = (iterator)&local_148;
  QList<QVariant>::QList((QList<QVariant> *)&local_1f8,args);
  bVar5 = QTest::qCompare<QVariant>
                    (&values,(QList<QVariant> *)&local_1f8,"values",
                     "(QVariantList{42, QString{\"43\"}, 44})",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                     ,0x5c);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_1f8);
  lVar6 = 0x40;
  do {
    QVariant::~QVariant((QVariant *)((long)&local_148 + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
  if (bVar5) {
    bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                      (&(input.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    local_148.data[0] = bVar5;
    local_1f8.d._0_1_ = 1;
    bVar5 = QTest::qCompare<bool,bool>
                      ((bool *)local_148.data,(bool *)&local_1f8,"input.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                       ,0x5d);
    if (bVar5) {
      bVar5 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isFulfilled
                        (&(output.super_QPromiseBase<QString>.m_d.d)->
                          super_PromiseDataBase<QString,_void_(const_QString_&)>);
      local_148.data[0] = bVar5;
      local_1f8.d._0_1_ = 1;
      QTest::qCompare<bool,bool>
                ((bool *)local_148.data,(bool *)&local_1f8,"output.isFulfilled()","true",
                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                 ,0x5e);
    }
  }
  QtPromise::QPromiseBase<QString>::~QPromiseBase(&output.super_QPromiseBase<QString>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&input.super_QPromiseBase<int>);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&values.d);
  return;
}

Assistant:

float fnArgByVal(float v) const { return v + m_v; }